

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::OpenPopupEx(char *str_id,bool reopen_existing)

{
  int *piVar1;
  ImVec2 IVar2;
  ImGuiWindow *this;
  ImGuiContext *pIVar3;
  ImGuiID IVar4;
  ImGuiID IVar5;
  ImGuiPopupRef *__dest;
  ImGuiContext *pIVar6;
  int iVar7;
  int iVar8;
  ImGuiPopupRef *pIVar9;
  int iVar10;
  
  pIVar3 = GImGui;
  this = GImGui->CurrentWindow;
  IVar4 = ImGuiWindow::GetID(this,str_id,(char *)0x0);
  iVar7 = (pIVar3->CurrentPopupStack).Size;
  IVar5 = ImGuiWindow::GetID(this,"##menus",(char *)0x0);
  pIVar6 = GImGui;
  IVar2 = (pIVar3->IO).MousePos;
  iVar10 = (pIVar3->OpenPopupStack).Size;
  if (iVar10 <= iVar7) {
    if (iVar10 == (pIVar3->OpenPopupStack).Capacity) {
      if (iVar10 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar10 / 2 + iVar10;
      }
      iVar8 = iVar10 + 1;
      if (iVar10 + 1 < iVar7) {
        iVar8 = iVar7;
      }
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + 1;
      __dest = (ImGuiPopupRef *)(*(pIVar6->IO).MemAllocFn)((long)iVar8 * 0x28);
      pIVar9 = (pIVar3->OpenPopupStack).Data;
      if (pIVar9 == (ImGuiPopupRef *)0x0) {
LAB_00126295:
        pIVar9 = (ImGuiPopupRef *)0x0;
        pIVar6 = GImGui;
      }
      else {
        memcpy(__dest,pIVar9,(long)(pIVar3->OpenPopupStack).Size * 0x28);
        pIVar6 = GImGui;
        pIVar9 = (pIVar3->OpenPopupStack).Data;
        if (pIVar9 == (ImGuiPopupRef *)0x0) goto LAB_00126295;
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + -1;
      }
      (*(pIVar6->IO).MemFreeFn)(pIVar9);
      (pIVar3->OpenPopupStack).Data = __dest;
      (pIVar3->OpenPopupStack).Capacity = iVar8;
      iVar7 = (pIVar3->OpenPopupStack).Size;
    }
    else {
      __dest = (pIVar3->OpenPopupStack).Data;
      iVar7 = iVar10;
    }
    iVar10 = iVar7 + 1;
    goto LAB_00126363;
  }
  if ((!reopen_existing) && ((pIVar3->OpenPopupStack).Data[iVar7].PopupId == IVar4)) {
    return;
  }
  iVar10 = iVar7 + 1;
  iVar8 = (pIVar3->OpenPopupStack).Capacity;
  if (iVar7 < iVar8) {
    __dest = (pIVar3->OpenPopupStack).Data;
    goto LAB_00126363;
  }
  if (iVar8 == 0) {
    iVar8 = 8;
  }
  else {
    iVar8 = iVar8 / 2 + iVar8;
  }
  if (iVar8 <= iVar10) {
    iVar8 = iVar10;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (ImGuiPopupRef *)(*(pIVar6->IO).MemAllocFn)((long)iVar8 * 0x28);
  pIVar9 = (pIVar3->OpenPopupStack).Data;
  if (pIVar9 == (ImGuiPopupRef *)0x0) {
LAB_0012633e:
    pIVar9 = (ImGuiPopupRef *)0x0;
    pIVar6 = GImGui;
  }
  else {
    memcpy(__dest,pIVar9,(long)(pIVar3->OpenPopupStack).Size * 0x28);
    pIVar6 = GImGui;
    pIVar9 = (pIVar3->OpenPopupStack).Data;
    if (pIVar9 == (ImGuiPopupRef *)0x0) goto LAB_0012633e;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar6->IO).MemFreeFn)(pIVar9);
  (pIVar3->OpenPopupStack).Data = __dest;
  (pIVar3->OpenPopupStack).Capacity = iVar8;
LAB_00126363:
  (pIVar3->OpenPopupStack).Size = iVar10;
  __dest[iVar7].PopupId = IVar4;
  __dest[iVar7].Window = (ImGuiWindow *)0x0;
  __dest[iVar7].ParentWindow = this;
  __dest[iVar7].ParentMenuSet = IVar5;
  __dest[iVar7].MousePosOnOpen = IVar2;
  return;
}

Assistant:

void ImGui::OpenPopupEx(const char* str_id, bool reopen_existing)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetID(str_id);
    int current_stack_size = g.CurrentPopupStack.Size;
    ImGuiPopupRef popup_ref = ImGuiPopupRef(id, window, window->GetID("##menus"), g.IO.MousePos); // Tagged as new ref because constructor sets Window to NULL (we are passing the ParentWindow info here)
    if (g.OpenPopupStack.Size < current_stack_size + 1)
        g.OpenPopupStack.push_back(popup_ref);
    else if (reopen_existing || g.OpenPopupStack[current_stack_size].PopupId != id)
    {
        g.OpenPopupStack.resize(current_stack_size+1);
        g.OpenPopupStack[current_stack_size] = popup_ref;
    }
}